

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O0

int dhm_update_blinding(mbedtls_dhm_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,
                       void *p_rng)

{
  int iVar1;
  size_t size;
  int local_30;
  int local_2c;
  int count;
  int ret;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_dhm_context *ctx_local;
  
  iVar1 = mbedtls_mpi_cmp_mpi(&ctx->X,&ctx->pX);
  if (iVar1 == 0) {
    iVar1 = mbedtls_mpi_cmp_int(&ctx->Vi,1);
    if (iVar1 == 0) {
      local_30 = 0;
      do {
        size = mbedtls_mpi_size(&ctx->P);
        mbedtls_mpi_fill_random(&ctx->Vi,size,f_rng,p_rng);
        while (iVar1 = mbedtls_mpi_cmp_mpi(&ctx->Vi,&ctx->P), -1 < iVar1) {
          iVar1 = mbedtls_mpi_shift_r(&ctx->Vi,1);
          if (iVar1 != 0) {
            return iVar1;
          }
        }
        if (10 < local_30) {
          return -0xe;
        }
        iVar1 = mbedtls_mpi_cmp_int(&ctx->Vi,1);
        local_30 = local_30 + 1;
      } while (iVar1 < 1);
      local_2c = mbedtls_mpi_inv_mod(&ctx->Vf,&ctx->Vi,&ctx->P);
      if (local_2c == 0) {
        local_2c = mbedtls_mpi_exp_mod(&ctx->Vf,&ctx->Vf,&ctx->X,&ctx->P,&ctx->RP);
      }
    }
    else {
      local_2c = mbedtls_mpi_mul_mpi(&ctx->Vi,&ctx->Vi,&ctx->Vi);
      if ((((local_2c == 0) &&
           (local_2c = mbedtls_mpi_mod_mpi(&ctx->Vi,&ctx->Vi,&ctx->P), local_2c == 0)) &&
          (local_2c = mbedtls_mpi_mul_mpi(&ctx->Vf,&ctx->Vf,&ctx->Vf), local_2c == 0)) &&
         (local_2c = mbedtls_mpi_mod_mpi(&ctx->Vf,&ctx->Vf,&ctx->P), local_2c == 0)) {
        return 0;
      }
    }
  }
  else {
    local_2c = mbedtls_mpi_copy(&ctx->pX,&ctx->X);
    if (((local_2c == 0) && (local_2c = mbedtls_mpi_lset(&ctx->Vi,1), local_2c == 0)) &&
       (local_2c = mbedtls_mpi_lset(&ctx->Vf,1), local_2c == 0)) {
      return 0;
    }
  }
  return local_2c;
}

Assistant:

static int dhm_update_blinding( mbedtls_dhm_context *ctx,
                    int (*f_rng)(void *, unsigned char *, size_t), void *p_rng )
{
    int ret, count;

    /*
     * Don't use any blinding the first time a particular X is used,
     * but remember it to use blinding next time.
     */
    if( mbedtls_mpi_cmp_mpi( &ctx->X, &ctx->pX ) != 0 )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &ctx->pX, &ctx->X ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &ctx->Vi, 1 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_lset( &ctx->Vf, 1 ) );

        return( 0 );
    }

    /*
     * Ok, we need blinding. Can we re-use existing values?
     * If yes, just update them by squaring them.
     */
    if( mbedtls_mpi_cmp_int( &ctx->Vi, 1 ) != 0 )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &ctx->Vi, &ctx->Vi, &ctx->Vi ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &ctx->Vi, &ctx->Vi, &ctx->P ) );

        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &ctx->Vf, &ctx->Vf, &ctx->Vf ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &ctx->Vf, &ctx->Vf, &ctx->P ) );

        return( 0 );
    }

    /*
     * We need to generate blinding values from scratch
     */

    /* Vi = random( 2, P-1 ) */
    count = 0;
    do
    {
        mbedtls_mpi_fill_random( &ctx->Vi, mbedtls_mpi_size( &ctx->P ), f_rng, p_rng );

        while( mbedtls_mpi_cmp_mpi( &ctx->Vi, &ctx->P ) >= 0 )
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &ctx->Vi, 1 ) );

        if( count++ > 10 )
            return( MBEDTLS_ERR_MPI_NOT_ACCEPTABLE );
    }
    while( mbedtls_mpi_cmp_int( &ctx->Vi, 1 ) <= 0 );

    /* Vf = Vi^-X mod P */
    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &ctx->Vf, &ctx->Vi, &ctx->P ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &ctx->Vf, &ctx->Vf, &ctx->X, &ctx->P, &ctx->RP ) );

cleanup:
    return( ret );
}